

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_shared_qualifier
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  bool bVar2;
  ContextType ctxType;
  GLuint program;
  GLuint shader;
  char *__s;
  SsboArgs *in_RCX;
  SsboArgs *args;
  long lVar3;
  TestLog *in_R8;
  TestLog *log;
  ulong uVar4;
  GLint linkStatus;
  ArgMember local_5cc;
  GLuint local_5c8;
  allocator<char> local_5c2;
  allocator<char> local_5c1;
  allocator<char> local_5c0;
  allocator<char> local_5bf;
  allocator<char> local_5be;
  allocator<char> local_5bd;
  allocator<char> local_5bc [4];
  allocator<char> local_5b8 [4];
  allocator<char> local_5b4 [4];
  _Alloc_hider local_5b0;
  string shaderFragmentString;
  ArgMember local_584;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  undefined1 local_560 [8];
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorVert;
  string message;
  char *shaderFragmentCharPtr;
  char *shaderVertexCharPtr;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  local_4e8;
  string shaderVertexString;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  local_4b0;
  string local_498;
  string versionString;
  SsboArgData argDataArrayFrag [3];
  undefined1 local_3e0 [40];
  undefined1 local_3b8 [384];
  SsboArgData argDataArrayVert [6];
  undefined1 local_148 [8];
  SsboArgs ssboArgs;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_5b0._M_p = (pointer)(ctx->super_CallLogWrapper).m_log;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  __s = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&versionString,__s,(allocator<char> *)local_3b8);
  std::__cxx11::string::string((string *)&local_498,(string *)&versionString);
  anon_unknown_0::args::SsboArgs::SsboArgs(&ssboArgs,&local_498,(TestLog *)local_5b0._M_p);
  std::__cxx11::string::~string((string *)&local_498);
  shaderVertexString._M_dataplus._M_p = (pointer)&shaderVertexString.field_2;
  shaderVertexString._M_string_length = 0;
  shaderVertexString.field_2._M_local_buf[0] = '\0';
  linkStatus = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3b8,"shared",&local_5bd);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayVert,(ArgMember *)&linkStatus,(string *)local_3b8);
  local_5cc = ARGMEMBER_BINDING_POINT;
  std::__cxx11::string::string<std::allocator<char>>((string *)argDataArrayFrag,"0",&local_5be);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayVert + 1,&local_5cc,(string *)argDataArrayFrag);
  local_5b4[0] = (allocator<char>)0x2;
  local_5b4[1] = (allocator<char>)0x0;
  local_5b4[2] = (allocator<char>)0x0;
  local_5b4[3] = (allocator<char>)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderFragmentString,"column_major",&local_5bf);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayVert + 2,(ArgMember *)local_5b4,&shaderFragmentString);
  local_5b8[0] = (allocator<char>)0x5;
  local_5b8[1] = (allocator<char>)0x0;
  local_5b8[2] = (allocator<char>)0x0;
  local_5b8[3] = (allocator<char>)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&argDataVectorFrag,"10",&local_5c0);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayVert + 3,(ArgMember *)local_5b8,(string *)&argDataVectorFrag);
  local_5bc[0] = (allocator<char>)0x6;
  local_5bc[1] = (allocator<char>)0x0;
  local_5bc[2] = (allocator<char>)0x0;
  local_5bc[3] = (allocator<char>)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&argDataVectorVert,"10",&local_5c1);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayVert + 4,(ArgMember *)local_5bc,(string *)&argDataVectorVert);
  local_584 = ARGMEMBER_REORDER;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderFragmentCharPtr,"false",&local_5c2);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayVert + 5,&local_584,(string *)&shaderFragmentCharPtr);
  std::__cxx11::string::~string((string *)&shaderFragmentCharPtr);
  std::__cxx11::string::~string((string *)&argDataVectorVert);
  std::__cxx11::string::~string((string *)&argDataVectorFrag);
  std::__cxx11::string::~string((string *)&shaderFragmentString);
  std::__cxx11::string::~string((string *)argDataArrayFrag);
  std::__cxx11::string::~string((string *)local_3b8);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&argDataVectorVert,argDataArrayVert,(SsboArgData *)local_148,
             (allocator_type *)in_RCX);
  shaderFragmentCharPtr = (char *)CONCAT44(shaderFragmentCharPtr._4_4_,2);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3b8,"row_major",local_5b4);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag,(ArgMember *)&shaderFragmentCharPtr,(string *)local_3b8);
  linkStatus = 6;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderFragmentString,glcts::fixed_sample_locations_values + 1,local_5b8);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag + 1,(ArgMember *)&linkStatus,&shaderFragmentString);
  local_5cc = ARGMEMBER_FIXED_ARRAY;
  std::__cxx11::string::string<std::allocator<char>>((string *)&argDataVectorFrag,"20",local_5bc);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag + 2,&local_5cc,(string *)&argDataVectorFrag);
  std::__cxx11::string::~string((string *)&argDataVectorFrag);
  std::__cxx11::string::~string((string *)&shaderFragmentString);
  std::__cxx11::string::~string((string *)local_3b8);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&argDataVectorFrag,argDataArrayFrag,(SsboArgData *)local_3e0,
             (allocator_type *)in_RCX);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::vector(&local_4e8,&argDataVectorVert);
  bVar2 = anon_unknown_0::args::SsboArgs::setAllValues(&ssboArgs,&local_4e8);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector(&local_4e8);
  if (bVar2) {
    NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
              ((string *)local_3b8,(_anonymous_namespace_ *)0x8b31,(GLenum)&ssboArgs,in_RCX,in_R8);
    std::__cxx11::string::operator=((string *)&shaderVertexString,(string *)local_3b8);
    std::__cxx11::string::~string((string *)local_3b8);
    shaderVertexCharPtr = shaderVertexString._M_dataplus._M_p;
    local_5c8 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
    std::__cxx11::string::_M_assign((string *)&message);
    poVar1 = (ostringstream *)(local_3b8 + 8);
    local_3b8._0_8_ = local_5b0._M_p;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    log = (TestLog *)0x0;
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,local_5c8,1,&shaderVertexCharPtr,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,local_5c8);
    poVar1 = (ostringstream *)(local_3b8 + 8);
    local_560 = (undefined1  [8])
                argDataVectorFrag.
                super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                ._M_impl.super__Vector_impl_data._M_start;
    args = (SsboArgs *)0x28;
    for (uVar4 = 0;
        uVar4 < (ulong)(((long)argDataVectorFrag.
                               super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)argDataVectorFrag.
                              super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x28); uVar4 = uVar4 + 1)
    {
      linkStatus = -1;
      shaderFragmentString._M_dataplus._M_p = (pointer)&shaderFragmentString.field_2;
      shaderFragmentString._M_string_length = 0;
      shaderFragmentString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3b8,
                 "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
                 ,(allocator<char> *)&local_5cc);
      NegativeTestContext::beginSection(ctx,(string *)local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
      std::
      vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
      ::vector(&local_4b0,&argDataVectorVert);
      anon_unknown_0::args::SsboArgs::setAllValues(&ssboArgs,&local_4b0);
      std::
      vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
      ::~vector(&local_4b0);
      anon_unknown_0::args::SsboArgData::SsboArgData
                ((SsboArgData *)local_3e0,(SsboArgData *)local_560);
      anon_unknown_0::args::SsboArgs::setSingleValue(&ssboArgs,(SsboArgData *)local_3e0);
      std::__cxx11::string::~string((string *)(local_3e0 + 8));
      NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
                ((string *)local_3b8,(_anonymous_namespace_ *)0x8b30,(GLenum)&ssboArgs,args,log);
      std::__cxx11::string::operator=((string *)&shaderFragmentString,(string *)local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      shaderFragmentCharPtr = shaderFragmentString._M_dataplus._M_p;
      shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
      std::__cxx11::string::_M_assign((string *)&message);
      local_3b8._0_8_ = local_5b0._M_p;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&message);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      log = (TestLog *)0x0;
      glu::CallLogWrapper::glShaderSource
                (&ctx->super_CallLogWrapper,shader,1,&shaderFragmentCharPtr,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader);
      glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,local_5c8);
      glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader);
      glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program);
      args = (SsboArgs *)&linkStatus;
      glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,program,0x8b82,(GLint *)args);
      logProgramInfo(ctx,program);
      if (linkStatus == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3b8,"Program should not have linked",
                   (allocator<char> *)&local_5cc);
        NegativeTestContext::fail(ctx,(string *)local_3b8);
        std::__cxx11::string::~string((string *)local_3b8);
      }
      glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
      glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
      NegativeTestContext::endSection(ctx);
      std::__cxx11::string::~string((string *)&shaderFragmentString);
      local_560 = (undefined1  [8])((long)local_560 + 0x28);
    }
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,local_5c8);
  }
  else {
    std::__cxx11::string::assign((char *)&message);
    poVar1 = (ostringstream *)(local_3b8 + 8);
    local_3b8._0_8_ = local_5b0._M_p;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector(&argDataVectorFrag);
  lVar3 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&argDataArrayFrag[0].member + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector(&argDataVectorVert);
  lVar3 = 0xd0;
  do {
    std::__cxx11::string::~string((string *)((long)&argDataArrayVert[0].member + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&shaderVertexString);
  anon_unknown_0::args::SsboArgs::~SsboArgs(&ssboArgs);
  std::__cxx11::string::~string((string *)&versionString);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void ssbo_block_shared_qualifier(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	bool					result;
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// default args used in vertex shader ssbo
	const args::SsboArgData argDataArrayVert[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"shared"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"0"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"column_major"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"10"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"10"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"false") };
	std::vector<args::SsboArgData> argDataVectorVert(argDataArrayVert, argDataArrayVert + sizeof(argDataArrayVert) / sizeof(argDataArrayVert[0]));

	// args changed in fragment shader ssbo
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	""),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// set default vertex ssbo args
	result = ssboArgs.setAllValues(argDataVectorVert);

	if (result == false)
	{
		message = "Invalid use of args.setAllValues()";
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		return;
	}

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); idx++)
	{
		GLint		linkStatus				=	-1;
		GLint		program;
		GLint		shaderFragmentGL;
		std::string	shaderFragmentString;
		const char*	shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.setAllValues(argDataVectorVert);
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to the program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}